

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O3

int __thiscall vm_val_t::is_listlike(vm_val_t *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = get_as_list(this);
  uVar1 = 1;
  if ((pcVar3 == (char *)0x0) && (uVar1 = 0, this->typ == VM_OBJ)) {
    lVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(this->val).obj >> 0xc]
                                   [(this->val).obj & 0xfff].ptr_ + 400))();
    uVar1 = 1;
    if (lVar4 == 0) {
      iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(this->val).obj >> 0xc]
                                     [(this->val).obj & 0xfff].ptr_ + 0x198))();
      uVar1 = (uint)(iVar2 != 0);
    }
  }
  return uVar1;
}

Assistant:

int vm_val_t::is_listlike(VMG0_) const
{
    return (get_as_list(vmg0_) != 0
            || (typ == VM_OBJ
                && (vm_objp(vmg_ val.obj)->get_as_list()
                    || vm_objp(vmg_ val.obj)->is_listlike(vmg_ val.obj))));
}